

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDL3LINESTRIKE_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_000002c8;
  double *in_stack_000002d0;
  double *in_stack_000002d8;
  double *in_stack_000002e0;
  int in_stack_000002ec;
  int in_stack_000002f0;
  int *in_stack_00000300;
  int *in_stack_00000308;
  int *in_stack_00000310;
  
  TVar1 = TA_CDL3LINESTRIKE(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0,in_stack_000002d8,
                            in_stack_000002d0,in_stack_000002c8,in_stack_00000300,in_stack_00000308,
                            in_stack_00000310);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDL3LINESTRIKE_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDL3LINESTRIKE(
/* Generated */                        startIdx,
/* Generated */                        endIdx,
/* Generated */                        params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                        params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                        params->in[0].data.inPrice.low, /* inLow */
/* Generated */                        params->in[0].data.inPrice.close, /* inClose */
/* Generated */                        outBegIdx, 
/* Generated */                        outNBElement, 
/* Generated */                        params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }